

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall
stackjit::ExecutionEngine::loadImage
          (ExecutionEngine *this,AssemblyImage *image,AssemblyType assemblyType)

{
  __type _Var1;
  Function *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  runtime_error *prVar3;
  PrimitiveTypes primitiveType;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (assemblyType == Program) {
    std::__cxx11::string::string((string *)&local_70,"main",(allocator *)&local_b0);
    this_00 = getFunction(image,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (this_00 == (Function *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"The main function must be defined.");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar2 = Loader::Function::parameters_abi_cxx11_(this_00);
    if ((pvVar2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (pvVar2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      Loader::Function::returnType_abi_cxx11_(&local_b0,this_00);
      TypeSystem::toString_abi_cxx11_(&local_90,(TypeSystem *)0x1,primitiveType);
      _Var1 = std::operator==(&local_b0,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      if (_Var1) goto LAB_0016146f;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    Loader::Function::toString_abi_cxx11_(&local_50,this_00);
    std::operator+(&local_90,"The main function must have the signature: \'main() Int\' but got \'",
                   &local_50);
    std::operator+(&local_b0,&local_90,"\'.");
    std::runtime_error::runtime_error(prVar3,(string *)&local_b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0016146f:
  ImageContainer::addImage(&this->mImageContainer,image);
  return;
}

Assistant:

void ExecutionEngine::loadImage(AssemblyImage* image, AssemblyType assemblyType) {
		if (assemblyType == AssemblyType::Program) {
			auto mainFunc = getFunction(*image, "main");

			if (mainFunc != nullptr) {
				if (!(mainFunc->parameters().size() == 0
					  && mainFunc->returnType() == TypeSystem::toString(PrimitiveTypes::Integer))) {
					throw std::runtime_error("The main function must have the signature: 'main() Int' but got '" + mainFunc->toString() + "'.");
				}
			} else {
				throw std::runtime_error("The main function must be defined.");
			}
		}

		mImageContainer.addImage(image);
	}